

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

exr_result_t
exr_attr_string_create_with_length(exr_context_t ctxt,exr_attr_string_t *s,char *d,int32_t len)

{
  char *__dest;
  int32_t in_ECX;
  exr_attr_string_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  char *outs;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if (in_RSI == (exr_context_t)0x0) {
    local_4 = (**(code **)(in_RDI + 0x40))
                        (in_RDI,3,"Invalid (NULL) arguments to string create with length");
  }
  else {
    local_4 = exr_attr_string_init(in_RSI,in_RDX,in_ECX);
    if (local_4 == 0) {
      __dest = *(char **)(in_RSI + 8);
      if (0 < in_ECX) {
        if (in_RDX == (exr_attr_string_t *)0x0) {
          memset(__dest,0,(long)in_ECX);
        }
        else {
          strncpy(__dest,(char *)in_RDX,(long)in_ECX);
        }
      }
      __dest[in_ECX] = '\0';
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_string_create_with_length (
    exr_context_t ctxt, exr_attr_string_t* s, const char* d, int32_t len)
{
    exr_result_t rv;
    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (!s)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid (NULL) arguments to string create with length");

    rv = exr_attr_string_init (ctxt, s, len);
    if (rv == EXR_ERR_SUCCESS)
    {
        /* we know we own the string memory */
        char* outs = EXR_CONST_CAST (char*, s->str);
        /* someone might pass in a string shorter than requested length (or longer) */
        if (len > 0)
        {
#ifdef _MSC_VER
#    pragma warning(push)
#    pragma warning(disable : 4996)
#endif
            if (d)
                strncpy (outs, d, (size_t) len);
            else
                memset (outs, 0, (size_t) len);
#ifdef _MSC_VER
#    pragma warning(pop)
#endif
        }
        outs[len] = '\0';
    }
    return rv;
}